

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O0

int Wln_ObjIsCio(Wln_Ntk_t *p,int i)

{
  int iVar1;
  undefined1 local_15;
  int i_local;
  Wln_Ntk_t *p_local;
  
  iVar1 = Wln_ObjType(p,i);
  local_15 = true;
  if (iVar1 != 3) {
    iVar1 = Wln_ObjType(p,i);
    local_15 = iVar1 == 4;
  }
  return (int)local_15;
}

Assistant:

static inline int          Wln_ObjIsCio( Wln_Ntk_t * p, int i )                  { return Wln_ObjType(p, i) == ABC_OPER_CI || Wln_ObjType(p, i)==ABC_OPER_CO; }